

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

char * uv_err_name_r(int err,char *buf,size_t buflen)

{
  char *s;
  
  switch(err) {
  case -0x7d:
    s = "ECANCELED";
    break;
  case -0x7c:
  case -0x7b:
  case -0x7a:
  case -0x78:
  case -0x77:
  case -0x76:
  case -0x75:
  case -0x74:
  case -0x73:
  case -0x6d:
  case -0x66:
  case -0x60:
  case -0x57:
  case -0x56:
  case -0x55:
  case -0x53:
  case -0x52:
  case -0x51:
  case -0x50:
  case -0x4f:
  case -0x4e:
  case -0x4d:
  case -0x4c:
  case -0x4a:
  case -0x49:
  case -0x48:
  case -0x46:
  case -0x45:
  case -0x44:
  case -0x43:
  case -0x42:
  case -0x41:
  case -0x3f:
  case -0x3e:
  case -0x3c:
  case -0x3b:
  case -0x3a:
  case -0x39:
  case -0x38:
  case -0x37:
  case -0x36:
  case -0x35:
  case -0x34:
  case -0x33:
  case -0x32:
  case -0x30:
  case -0x2f:
  case -0x2e:
  case -0x2d:
  case -0x2c:
  case -0x2b:
  case -0x2a:
  case -0x29:
  case -0x25:
  case -0x23:
  case -0x21:
  case -0xf:
  case -10:
  case -8:
switchD_0015d240_caseD_ffffff84:
    snprintf(buf,buflen,"Unknown system error %d");
    return buf;
  case -0x79:
    s = "EREMOTEIO";
    break;
  case -0x72:
    s = "EALREADY";
    break;
  case -0x71:
    s = "EHOSTUNREACH";
    break;
  case -0x70:
    s = "EHOSTDOWN";
    break;
  case -0x6f:
    s = "ECONNREFUSED";
    break;
  case -0x6e:
    s = "ETIMEDOUT";
    break;
  case -0x6c:
    s = "ESHUTDOWN";
    break;
  case -0x6b:
    s = "ENOTCONN";
    break;
  case -0x6a:
    s = "EISCONN";
    break;
  case -0x69:
    s = "ENOBUFS";
    break;
  case -0x68:
    s = "ECONNRESET";
    break;
  case -0x67:
    s = "ECONNABORTED";
    break;
  case -0x65:
    s = "ENETUNREACH";
    break;
  case -100:
    s = "ENETDOWN";
    break;
  case -99:
    s = "EADDRNOTAVAIL";
    break;
  case -0x62:
    s = "EADDRINUSE";
    break;
  case -0x61:
    s = "EAFNOSUPPORT";
    break;
  case -0x5f:
    s = "ENOTSUP";
    break;
  case -0x5e:
    s = "ESOCKTNOSUPPORT";
    break;
  case -0x5d:
    s = "EPROTONOSUPPORT";
    break;
  case -0x5c:
    s = "ENOPROTOOPT";
    break;
  case -0x5b:
    s = "EPROTOTYPE";
    break;
  case -0x5a:
    s = "EMSGSIZE";
    break;
  case -0x59:
    s = "EDESTADDRREQ";
    break;
  case -0x58:
    s = "ENOTSOCK";
    break;
  case -0x54:
    s = "EILSEQ";
    break;
  case -0x4b:
    s = "EOVERFLOW";
    break;
  case -0x47:
    s = "EPROTO";
    break;
  case -0x40:
    s = "ENONET";
    break;
  case -0x3d:
    s = "ENODATA";
    break;
  case -0x31:
    s = "EUNATCH";
    break;
  case -0x28:
    s = "ELOOP";
    break;
  case -0x27:
    s = "ENOTEMPTY";
    break;
  case -0x26:
    s = "ENOSYS";
    break;
  case -0x24:
    s = "ENAMETOOLONG";
    break;
  case -0x22:
    s = "ERANGE";
    break;
  case -0x20:
    s = "EPIPE";
    break;
  case -0x1f:
    s = "EMLINK";
    break;
  case -0x1e:
    s = "EROFS";
    break;
  case -0x1d:
    s = "ESPIPE";
    break;
  case -0x1c:
    s = "ENOSPC";
    break;
  case -0x1b:
    s = "EFBIG";
    break;
  case -0x1a:
    s = "ETXTBSY";
    break;
  case -0x19:
    s = "ENOTTY";
    break;
  case -0x18:
    s = "EMFILE";
    break;
  case -0x17:
    s = "ENFILE";
    break;
  case -0x16:
    s = "EINVAL";
    break;
  case -0x15:
    s = "EISDIR";
    break;
  case -0x14:
    s = "ENOTDIR";
    break;
  case -0x13:
    s = "ENODEV";
    break;
  case -0x12:
    s = "EXDEV";
    break;
  case -0x11:
    s = "EEXIST";
    break;
  case -0x10:
    s = "EBUSY";
    break;
  case -0xe:
    s = "EFAULT";
    break;
  case -0xd:
    s = "EACCES";
    break;
  case -0xc:
    s = "ENOMEM";
    break;
  case -0xb:
    s = "EAGAIN";
    break;
  case -9:
    s = "EBADF";
    break;
  case -7:
    s = "E2BIG";
    break;
  case -6:
    s = "ENXIO";
    break;
  case -5:
    s = "EIO";
    break;
  case -4:
    s = "EINTR";
    break;
  case -3:
    s = "ESRCH";
    break;
  case -2:
    s = "ENOENT";
    break;
  case -1:
    s = "EPERM";
    break;
  default:
    switch(err) {
    case -0xbc6:
      s = "EAI_PROTOCOL";
      break;
    case -0xbc5:
      s = "EAI_BADHINTS";
      break;
    case -0xbc4:
      goto switchD_0015d240_caseD_ffffff84;
    case -0xbc3:
      s = "EAI_SOCKTYPE";
      break;
    case -0xbc2:
      s = "EAI_SERVICE";
      break;
    case -0xbc1:
      s = "EAI_OVERFLOW";
      break;
    case -0xbc0:
      s = "EAI_NONAME";
      break;
    case -0xbbf:
      s = "EAI_NODATA";
      break;
    case -0xbbe:
      s = "EAI_MEMORY";
      break;
    case -0xbbd:
      s = "EAI_FAMILY";
      break;
    case -0xbbc:
      s = "EAI_FAIL";
      break;
    case -0xbbb:
      s = "EAI_CANCELED";
      break;
    case -0xbba:
      s = "EAI_BADFLAGS";
      break;
    case -0xbb9:
      s = "EAI_AGAIN";
      break;
    case -3000:
      s = "EAI_ADDRFAMILY";
      break;
    default:
      if (err == -0xfff) {
        s = "EOF";
      }
      else if (err == -0xffe) {
        s = "UNKNOWN";
      }
      else if (err == -0xff0) {
        s = "ECHARSET";
      }
      else {
        if (err != -0xfbc) goto switchD_0015d240_caseD_ffffff84;
        s = "EFTYPE";
      }
    }
  }
  uv__strscpy(buf,s,buflen);
  return buf;
}

Assistant:

char* uv_err_name_r(int err, char* buf, size_t buflen) {
  switch (err) {
    UV_ERRNO_MAP(UV_ERR_NAME_GEN_R)
    default: snprintf(buf, buflen, "Unknown system error %d", err);
  }
  return buf;
}